

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column.cpp
# Opt level: O2

void __thiscall column::fromString(column *this,string *str)

{
  bool bVar1;
  int iVar2;
  string tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::find((char *)str,0x11db3a);
  std::__cxx11::string::substr((ulong)&tmp,(ulong)str);
  std::__cxx11::string::operator=((string *)&this->name,(string *)&tmp);
  std::__cxx11::string::~string((string *)&tmp);
  std::__cxx11::string::substr((ulong)&tmp,(ulong)str);
  bVar1 = std::operator==(&tmp,"INT");
  if (bVar1) {
    std::__cxx11::string::assign((char *)&this->flag);
    this->element_size = 8;
    iVar2 = 8;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_48,(ulong)&tmp);
    bVar1 = std::operator==(&local_48,"CHAR");
    std::__cxx11::string::~string((string *)&local_48);
    if (!bVar1) goto LAB_00117163;
    std::__cxx11::string::assign((char *)&this->flag);
    std::__cxx11::string::find((char *)&tmp,0x11d726);
    std::__cxx11::string::substr((ulong)&local_48,(ulong)&tmp);
    std::__cxx11::string::operator=((string *)&tmp,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    iVar2 = std::__cxx11::stoi(&tmp,(size_t *)0x0,10);
    this->element_size = iVar2;
    iVar2 = iVar2 + 1;
  }
  this->element_truesize = iVar2;
LAB_00117163:
  std::__cxx11::string::~string((string *)&tmp);
  return;
}

Assistant:

void column::fromString(const string &str){
    int idx = str.find(":");
    name = str.substr(0, idx);
    string tmp = str.substr(idx+1);
    if(tmp == "INT"){
        flag = "INT";
        element_size = 8;
        element_truesize = 8;
    }
    else if(tmp.substr(0, 4) == "CHAR"){
        flag = "CHAR";
        idx = tmp.find(")");
        tmp  = tmp.substr(5, idx-5);
        element_size = stoi(tmp);
        element_truesize = element_size + 1;
    }
}